

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.h
# Opt level: O2

void __thiscall Connection::onClientDisconnected(Connection *this,SharedPtr *param_1)

{
  __shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  this->mIsConnected = false;
  std::__shared_ptr<Connection,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Connection,void>
            (local_20,(__weak_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)this);
  Signal<std::function<void(std::shared_ptr<Connection>)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<Connection>)>> *)&this->mDisconnected,
             (shared_ptr<Connection> *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void onClientDisconnected(const SocketClient::SharedPtr&) { mIsConnected = false; mDisconnected(shared_from_this()); }